

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wdgl.cpp
# Opt level: O2

uint32 rw::wdgl::skinInstanceCB(Geometry *g,int32 i,uint32 offset)

{
  undefined4 *puVar1;
  uint uVar2;
  InstanceDataHeader *pIVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  uint32 uVar8;
  ulong uVar9;
  float32 *src;
  long lVar10;
  
  pIVar3 = g->instData;
  lVar7 = *(long *)(pIVar3 + 2);
  lVar10 = (long)i * 0x18;
  *(undefined8 *)(lVar7 + lVar10) = 0x200000004;
  ((undefined8 *)(lVar7 + lVar10))[1] = 0x400000001;
  *(uint32 *)(lVar7 + 0x14 + lVar10) = offset;
  puVar1 = (undefined4 *)(lVar7 + 0x18 + lVar10);
  *puVar1 = 5;
  puVar1[1] = 2;
  puVar1[2] = 0;
  puVar1[3] = 4;
  *(uint32 *)(lVar7 + 0x2c + lVar10) = offset + 4;
  uVar8 = g->numVertices * (offset + 8);
  pIVar3[4].platform = uVar8;
  allocLocation =
       "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/gl/wdgl.cpp line: 617"
  ;
  lVar6 = (*DAT_00144da8)(uVar8,0x3000f);
  *(long *)(pIVar3 + 6) = lVar6;
  lVar7 = *(long *)((long)g->texCoords + (long)skinGlobals + -0x38);
  if (lVar7 != 0) {
    lVar4 = *(long *)(pIVar3 + 2);
    uVar2 = *(uint *)(lVar4 + 0x14 + lVar10);
    uVar9 = (ulong)*(uint *)(lVar4 + 0x2c + lVar10);
    lVar5 = *(long *)(lVar7 + 0x20);
    src = *(float32 **)(lVar7 + 0x28);
    for (lVar7 = 0; (int)lVar7 < g->numVertices; lVar7 = lVar7 + 1) {
      packattrib((uint8 *)(lVar6 + (ulong)uVar2),src,(AttribDesc *)(lVar4 + lVar10),1.0);
      src = src + 4;
      *(undefined1 *)(lVar6 + uVar9) = *(undefined1 *)(lVar5 + lVar7 * 4);
      *(undefined1 *)(lVar6 + 1 + uVar9) = *(undefined1 *)(lVar5 + 1 + lVar7 * 4);
      *(undefined1 *)(lVar6 + 2 + uVar9) = *(undefined1 *)(lVar5 + 2 + lVar7 * 4);
      *(undefined1 *)(lVar6 + 3 + uVar9) = *(undefined1 *)(lVar5 + 3 + lVar7 * 4);
      lVar6 = lVar6 + (ulong)(offset + 8);
    }
  }
  return 8;
}

Assistant:

uint32
skinInstanceCB(Geometry *g, int32 i, uint32 offset)
{
	InstanceDataHeader *header = (InstanceDataHeader*)g->instData;
	AttribDesc *a = &header->attribs[i];
	// weights
	a->index = 4;
	a->type = 2;	/* but also short o_O */
	a->normalized = 1;
	a->size = 4;
	a->offset = offset;
	offset += 4;
	a++;

	// indices
	a->index = 5;
	a->type = 2;
	a->normalized = 0;
	a->size = 4;
	a->offset = offset;
	offset += 4;

	header->dataSize = offset*g->numVertices;
	header->data = rwNewT(uint8, header->dataSize, MEMDUR_EVENT | ID_GEOMETRY);

	Skin *skin = Skin::get(g);
	if(skin == nil)
		return 8;

	a = &header->attribs[i];
	uint8 *wgt = header->data + a[0].offset;
	uint8 *idx = header->data + a[1].offset;
	uint8 *indices = skin->indices;
	float32 *weights = skin->weights;
	for(int32 i = 0; i < g->numVertices; i++){
		packattrib(wgt, weights, a);
		weights += 4;
		wgt += offset;
		idx[0] = *indices++;
		idx[1] = *indices++;
		idx[2] = *indices++;
		idx[3] = *indices++;
		idx += offset;
	}

	return 8;
}